

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O2

void __thiscall
cbtAlignedObjectArray<cbtCell32>::cbtAlignedObjectArray
          (cbtAlignedObjectArray<cbtCell32> *this,cbtAlignedObjectArray<cbtCell32> *otherArray)

{
  uint newsize;
  cbtCell32 local_98;
  
  this->m_ownsMemory = true;
  this->m_data = (cbtCell32 *)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  newsize = otherArray->m_size;
  local_98.m_cells[0x10] = 0;
  local_98.m_cells[0x11] = 0;
  local_98.m_cells[0x12] = 0;
  local_98.m_cells[0x13] = 0;
  local_98.m_cells[0x14] = 0;
  local_98.m_cells[0x15] = 0;
  local_98.m_cells[0x16] = 0;
  local_98.m_cells[0x17] = 0;
  local_98.m_cells[0x18] = 0;
  local_98.m_cells[0x19] = 0;
  local_98.m_cells[0x1a] = 0;
  local_98.m_cells[0x1b] = 0;
  local_98.m_cells[0x1c] = 0;
  local_98.m_cells[0x1d] = 0;
  local_98.m_cells[0x1e] = 0;
  local_98.m_cells[0x1f] = 0;
  local_98.m_cells[0] = 0;
  local_98.m_cells[1] = 0;
  local_98.m_cells[2] = 0;
  local_98.m_cells[3] = 0;
  local_98.m_cells[4] = 0;
  local_98.m_cells[5] = 0;
  local_98.m_cells[6] = 0;
  local_98.m_cells[7] = 0;
  local_98.m_cells[8] = 0;
  local_98.m_cells[9] = 0;
  local_98.m_cells[10] = 0;
  local_98.m_cells[0xb] = 0;
  local_98.m_cells[0xc] = 0;
  local_98.m_cells[0xd] = 0;
  local_98.m_cells[0xe] = 0;
  local_98.m_cells[0xf] = 0;
  resize(this,newsize,&local_98);
  copy(otherArray,(EVP_PKEY_CTX *)0x0,(EVP_PKEY_CTX *)(ulong)newsize);
  return;
}

Assistant:

cbtAlignedObjectArray(const cbtAlignedObjectArray& otherArray)
	{
		init();

		int otherSize = otherArray.size();
		resize(otherSize);
		otherArray.copy(0, otherSize, m_data);
	}